

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_input_is_key_released(nk_input *i,nk_keys key)

{
  int iVar1;
  
  iVar1 = 0;
  if (i != (nk_input *)0x0) {
    if ((i->keyboard).keys[key].down == 0) {
      iVar1 = 1;
      if ((i->keyboard).keys[key].clicked == 0) {
        return 0;
      }
    }
    else {
      iVar1 = 1;
      if ((i->keyboard).keys[key].clicked < 2) {
        return 0;
      }
    }
  }
  return iVar1;
}

Assistant:

NK_API int
nk_input_is_key_released(const struct nk_input *i, enum nk_keys key)
{
    const struct nk_key *k;
    if (!i) return nk_false;
    k = &i->keyboard.keys[key];
    if ((!k->down && k->clicked) || (k->down && k->clicked >= 2))
        return nk_true;
    return nk_false;
}